

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cpp
# Opt level: O2

void __thiscall VPPOperator::~VPPOperator(VPPOperator *this)

{
  (this->super_BaseNode)._vptr_BaseNode = (_func_int **)&PTR__VPPOperator_00188978;
  std::__cxx11::string::~string((string *)&this->command);
  BaseNode::~BaseNode(&this->super_BaseNode);
  return;
}

Assistant:

explicit VPPOperator() : BaseNode("vpp operator") { }